

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_string_should_fail_with_null_pointers(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *root;
  
  object = cJSON_CreateObject();
  pcVar1 = cJSON_AddStringToObject((cJSON *)0x0,"string","string");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",299);
  }
  pcVar1 = cJSON_AddStringToObject(object,(char *)0x0,"string");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",300);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_string_should_fail_with_null_pointers(void)
{
    cJSON *root = cJSON_CreateObject();

    TEST_ASSERT_NULL(cJSON_AddStringToObject(NULL, "string", "string"));
    TEST_ASSERT_NULL(cJSON_AddStringToObject(root, NULL, "string"));

    cJSON_Delete(root);
}